

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestGroupStats::TestGroupStats
          (TestGroupStats *this,GroupInfo *_groupInfo,Totals *_totals,bool _aborting)

{
  byte bVar1;
  byte in_CL;
  void *in_RDX;
  GroupInfo *in_RDI;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar1 = in_CL & 1;
  *(undefined ***)&in_RDI->name = &PTR__TestGroupStats_0048dd00;
  GroupInfo::GroupInfo
            ((GroupInfo *)(CONCAT17(in_CL,in_stack_ffffffffffffffe0) & 0x1ffffffffffffff),in_RDI);
  memcpy(&in_RDI[1].name._M_string_length,in_RDX,0x38);
  in_RDI[2].name.field_2._M_local_buf[0] = bVar1 & 1;
  return;
}

Assistant:

TestGroupStats::TestGroupStats( GroupInfo const& _groupInfo,
                                    Totals const& _totals,
                                    bool _aborting )
    :   groupInfo( _groupInfo ),
        totals( _totals ),
        aborting( _aborting )
    {}